

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t bid_sfx(archive_read *a)

{
  void *pvVar1;
  char *buff;
  ssize_t bytes_avail;
  ssize_t window;
  ssize_t offset;
  char signature [8];
  char *p;
  archive_read *a_local;
  
  signature = (char  [8])__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (signature == (char  [8])0x0) {
    a_local._4_4_ = L'\xffffffff';
  }
  else if (((*(char *)signature == 'M') && (*(char *)((long)signature + 1) == 'Z')) ||
          (*(int *)signature == 0x464c457f)) {
    window = 0x10000;
    bytes_avail = 0x1000;
    rar5_signature((char *)&offset);
    do {
      while( true ) {
        if (0x80000 < window + bytes_avail) goto LAB_00af32eb;
        pvVar1 = __archive_read_ahead(a,window + bytes_avail,(ssize_t *)&buff);
        if (pvVar1 == (void *)0x0) break;
        for (signature = (char  [8])((long)pvVar1 + window);
            (char *)((long)signature + 8U) < (char *)((long)pvVar1 + (long)buff);
            signature = (char  [8])((long)signature + 0x10)) {
          if (*(long *)signature == offset) {
            return L'\x1e';
          }
        }
        window = (long)signature - (long)pvVar1;
      }
      bytes_avail = bytes_avail >> 1;
    } while (0x3f < bytes_avail);
    a_local._4_4_ = L'\0';
  }
  else {
LAB_00af32eb:
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int bid_sfx(struct archive_read *a)
{
	const char *p;

	if ((p = __archive_read_ahead(a, 7, NULL)) == NULL)
		return -1;

	if ((p[0] == 'M' && p[1] == 'Z') || memcmp(p, "\x7F\x45LF", 4) == 0) {
		/* This is a PE file */
		char signature[sizeof(rar5_signature_xor)];
		ssize_t offset = 0x10000;
		ssize_t window = 4096;
		ssize_t bytes_avail;

		rar5_signature(signature);

		while (offset + window <= (1024 * 512)) {
			const char *buff = __archive_read_ahead(a, offset + window, &bytes_avail);
			if (buff == NULL) {
				/* Remaining bytes are less than window. */
				window >>= 1;
				if (window < 0x40)
					return 0;
				continue;
			}
			p = buff + offset;
			while (p + 8 < buff + bytes_avail) {
				if (memcmp(p, signature, sizeof(signature)) == 0)
					return 30;
				p += 0x10;
			}
			offset = p - buff;
		}
	}

	return 0;
}